

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkService.h
# Opt level: O0

void __thiscall
WorkerContext::WorkerContext
          (WorkerContext *this,string *identity,DatabaseSnapshot *snap,TaskSpec *task)

{
  long in_RCX;
  string *in_RSI;
  string *in_RDI;
  DatabaseSnapshot *this_00;
  DatabaseSnapshot *in_stack_ffffffffffffff88;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  this_00 = (DatabaseSnapshot *)(in_RDI + 0x20);
  DatabaseSnapshot::DatabaseSnapshot(this_00,in_stack_ffffffffffffff88);
  std::optional<Task>::optional((optional<Task> *)0x1565f5);
  if (in_RCX != 0) {
    std::make_optional<Task,TaskSpec*&>((TaskSpec **)in_RDI);
    std::optional<Task>::operator=
              ((optional<Task> *)this_00,(optional<Task> *)in_stack_ffffffffffffff88);
    std::optional<Task>::~optional((optional<Task> *)0x15662e);
  }
  return;
}

Assistant:

WorkerContext(std::string identity, DatabaseSnapshot &&snap, TaskSpec *task)
        : identity(identity), snap(std::move(snap)) {
        if (task != nullptr) {
            this->task = std::make_optional<Task>(task);
        }
    }